

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

mg_connection *
mg_download(char *host,int port,int use_ssl,char *ebuf,size_t ebuf_len,char *fmt,...)

{
  char in_AL;
  int iVar1;
  mg_connection *conn;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  int reqerr;
  va_list ap;
  mg_client_options local_130;
  __va_list_tag local_108;
  mg_init_data local_f0;
  undefined1 local_d8 [48];
  undefined4 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Da;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  if (ebuf_len != 0) {
    *ebuf = '\0';
  }
  local_108.reg_save_area = local_d8;
  local_108.overflow_arg_area = &reqerr;
  local_108.gp_offset = 0x30;
  local_108.fp_offset = 0x30;
  local_f0.callbacks = (mg_callbacks *)0x0;
  local_130.client_cert = (char *)0x0;
  local_130.server_cert = (char *)0x0;
  local_130.host_name = (char *)0x0;
  local_130._12_4_ = 0;
  local_130.port = port;
  if (use_ssl != 0) {
    local_130.host_name = host;
  }
  local_130.host = host;
  local_f0.user_data = ebuf;
  local_f0.configuration_options = (char **)ebuf_len;
  conn = mg_connect_client_impl(&local_130,use_ssl,&local_f0,(mg_error_data *)ebuf);
  if (conn != (mg_connection *)0x0) {
    iVar1 = mg_vprintf(conn,fmt,&local_108);
    if (iVar1 < 1) {
      mg_snprintf(conn,(int *)0x0,ebuf,ebuf_len,"%s","Error sending request");
    }
    else {
      conn->data_len = 0;
      get_response(conn,ebuf,ebuf_len,(int *)&local_130);
      (conn->request_info).local_uri = (conn->request_info).request_uri;
    }
    if (*ebuf == '\0') {
      return conn;
    }
    mg_close_connection(conn);
  }
  return (mg_connection *)0x0;
}

Assistant:

mg_connection *
mg_download(const char *host,
            int port,
            int use_ssl,
            char *ebuf,
            size_t ebuf_len,
            const char *fmt,
            ...)
{
	struct mg_connection *conn;
	va_list ap;
	int i;
	int reqerr;

	if (ebuf_len > 0) {
		ebuf[0] = '\0';
	}

	va_start(ap, fmt);

	/* open a connection */
	conn = mg_connect_client(host, port, use_ssl, ebuf, ebuf_len);

	if (conn != NULL) {
		i = mg_vprintf(conn, fmt, ap);
		if (i <= 0) {
			mg_snprintf(conn,
			            NULL, /* No truncation check for ebuf */
			            ebuf,
			            ebuf_len,
			            "%s",
			            "Error sending request");
		} else {
			/* make sure the buffer is clear */
			conn->data_len = 0;
			get_response(conn, ebuf, ebuf_len, &reqerr);

			/* TODO: here, the URI is the http response code */
			conn->request_info.local_uri = conn->request_info.request_uri;
		}
	}

	/* if an error occurred, close the connection */
	if ((ebuf[0] != '\0') && (conn != NULL)) {
		mg_close_connection(conn);
		conn = NULL;
	}

	va_end(ap);
	return conn;
}